

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O0

UINT8 Pulse_Destroy(void *drvObj)

{
  DRV_PULSE *drv;
  void *drvObj_local;
  
  if (*(char *)((long)drvObj + 8) != '\0') {
    Pulse_Stop(drvObj);
  }
  if (*(long *)((long)drvObj + 0x30) != 0) {
    OSThread_Cancel(*(OS_THREAD **)((long)drvObj + 0x30));
    OSThread_Deinit(*(OS_THREAD **)((long)drvObj + 0x30));
  }
  if (*(long *)((long)drvObj + 0x38) != 0) {
    OSSignal_Deinit(*(OS_SIGNAL **)((long)drvObj + 0x38));
  }
  if (*(long *)((long)drvObj + 0x40) != 0) {
    OSMutex_Deinit(*(OS_MUTEX **)((long)drvObj + 0x40));
  }
  free(*(void **)((long)drvObj + 0x58));
  free(drvObj);
  activeDrivers = activeDrivers - 1;
  return '\0';
}

Assistant:

UINT8 Pulse_Destroy(void* drvObj)
{
	DRV_PULSE* drv = (DRV_PULSE*)drvObj;
	
	if (drv->devState != 0)
		Pulse_Stop(drvObj);
	if (drv->hThread != NULL)
	{
		OSThread_Cancel(drv->hThread);
		OSThread_Deinit(drv->hThread);
	}
	if (drv->hSignal != NULL)
		OSSignal_Deinit(drv->hSignal);
	if (drv->hMutex != NULL)
		OSMutex_Deinit(drv->hMutex);
	
	free(drv->streamDesc);
	free(drv);
	activeDrivers --;
	
	return AERR_OK;
}